

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpacktable.cpp
# Opt level: O0

bool __thiscall HPack::FieldLookupTable::updateDynamicTableSize(FieldLookupTable *this,quint32 size)

{
  bool bVar1;
  uint in_ESI;
  FieldLookupTable *in_RDI;
  FieldLookupTable *this_00;
  bool local_1;
  
  if (in_ESI == 0) {
    clearDynamicTable(in_RDI);
    in_RDI->tableCapacity = 0;
    local_1 = true;
  }
  else if (in_RDI->maxTableSize < in_ESI) {
    local_1 = false;
  }
  else {
    in_RDI->tableCapacity = in_ESI;
    this_00 = in_RDI;
    while( true ) {
      bVar1 = false;
      if (in_RDI->nDynamic != 0) {
        bVar1 = in_RDI->tableCapacity < in_RDI->dataSize;
      }
      if (!bVar1) break;
      evictEntry(this_00);
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool FieldLookupTable::updateDynamicTableSize(quint32 size)
{
    if (!size) {
        clearDynamicTable();
        tableCapacity = 0;
        return true;
    }

    if (size > maxTableSize)
        return false;

    tableCapacity = size;
    while (nDynamic && dataSize > tableCapacity)
        evictEntry();

    return true;
}